

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_rename_to_existing_file(void)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  __off64_t _Var6;
  uv_buf_t *bufs;
  char *pcVar7;
  uv_fs_t *puVar8;
  uv_fs_t *unaff_R14;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  uv_buf_t uVar12;
  char acStack_482 [2];
  uv_loop_t *puStack_480;
  uv_buf_t uStack_3e8;
  uv_buf_t uStack_3d8;
  uv_loop_t *puStack_3c0;
  uv_fs_t *puStack_3b8;
  uv_fs_t *puStack_3b0;
  uv_buf_t uStack_378;
  uv_buf_t uStack_368;
  uv_buf_t uStack_358;
  uv_buf_t uStack_348;
  char acStack_338 [256];
  char acStack_238 [256];
  char acStack_138 [128];
  char acStack_b8 [136];
  uv_loop_t *puStack_30;
  
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar3 = 0;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_fs_rename_to_existing_file_cold_1();
LAB_001553cf:
    run_test_fs_rename_to_existing_file_cold_2();
LAB_001553d4:
    run_test_fs_rename_to_existing_file_cold_3();
LAB_001553d9:
    run_test_fs_rename_to_existing_file_cold_4();
LAB_001553de:
    run_test_fs_rename_to_existing_file_cold_5();
LAB_001553e3:
    run_test_fs_rename_to_existing_file_cold_6();
LAB_001553e8:
    run_test_fs_rename_to_existing_file_cold_7();
LAB_001553ed:
    run_test_fs_rename_to_existing_file_cold_8();
LAB_001553f2:
    run_test_fs_rename_to_existing_file_cold_9();
LAB_001553f7:
    run_test_fs_rename_to_existing_file_cold_10();
LAB_001553fc:
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00155401:
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00155406:
    run_test_fs_rename_to_existing_file_cold_13();
LAB_0015540b:
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00155410:
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00155415:
    run_test_fs_rename_to_existing_file_cold_16();
LAB_0015541a:
    run_test_fs_rename_to_existing_file_cold_17();
LAB_0015541f:
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00155424:
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001553cf;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar3 = 0;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001553d4;
    if (write_req.result < 0) goto LAB_001553d9;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553de;
    if (close_req.result != 0) goto LAB_001553e3;
    uv_fs_req_cleanup(&close_req);
    iVar3 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001553e8;
    if (open_req1.result._4_4_ < 0) goto LAB_001553ed;
    uv_fs_req_cleanup(&open_req1);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553f2;
    if (close_req.result != 0) goto LAB_001553f7;
    uv_fs_req_cleanup(&close_req);
    iVar3 = 0;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553fc;
    if (rename_req.result != 0) goto LAB_00155401;
    uv_fs_req_cleanup(&rename_req);
    iVar3 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155406;
    if (open_req1.result._4_4_ < 0) goto LAB_0015540b;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar12 = uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_00155410;
    if (read_req.result < 0) goto LAB_00155415;
    iVar3 = 0x2fbca0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015541a;
    uv_fs_req_cleanup(&read_req);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015541f;
    if (close_req.result != 0) goto LAB_00155424;
    uv_fs_req_cleanup(&close_req);
    unlink("test_file");
    unlink("test_file2");
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    iVar3 = (int)puVar4;
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_fs_rename_to_existing_file_cold_20();
  fs_read_bufs(iVar3);
  fs_read_bufs(iVar3);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_read_bufs_cold_1();
  iVar3 = 0;
  puStack_30 = puVar4;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_read_bufs_cold_1();
LAB_001556d5:
    fs_read_bufs_cold_2();
LAB_001556da:
    fs_read_bufs_cold_3();
LAB_001556df:
    fs_read_bufs_cold_4();
LAB_001556e4:
    fs_read_bufs_cold_5();
LAB_001556e9:
    fs_read_bufs_cold_6();
LAB_001556ee:
    fs_read_bufs_cold_7();
LAB_001556f3:
    fs_read_bufs_cold_8();
LAB_001556f8:
    fs_read_bufs_cold_9();
LAB_001556fd:
    fs_read_bufs_cold_10();
LAB_00155702:
    fs_read_bufs_cold_11();
LAB_00155707:
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001556d5;
    uv_fs_req_cleanup(&open_req1);
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556da;
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556df;
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_378,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556e4;
    uStack_378 = uv_buf_init(acStack_338,0x100);
    uStack_368 = uv_buf_init(acStack_238,0x100);
    uStack_358 = uv_buf_init(acStack_138,0x80);
    uStack_348 = uv_buf_init(acStack_b8,0x80);
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_378,2,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0x1be) goto LAB_001556e9;
    if (read_req.result != 0x1be) goto LAB_001556ee;
    unaff_R14 = &read_req;
    uv_fs_req_cleanup(&read_req);
    iVar3 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_358,2,0x100,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0xbe) goto LAB_001556f3;
    if (read_req.result != 0xbe) goto LAB_001556f8;
    uv_fs_req_cleanup(&read_req);
    pcVar7 = uStack_368.base;
    pcVar11 = uStack_368.base;
    iVar2 = bcmp(uStack_368.base,uStack_358.base,0x80);
    iVar3 = (int)pcVar11;
    if (iVar2 != 0) goto LAB_001556fd;
    pcVar7 = pcVar7 + 0x80;
    iVar2 = bcmp(pcVar7,uStack_348.base,0x3e);
    iVar3 = (int)pcVar7;
    if (iVar2 != 0) goto LAB_00155702;
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155707;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      return extraout_EAX;
    }
  }
  fs_read_bufs_cold_13();
  fs_read_file_eof(iVar3);
  fs_read_file_eof(iVar3);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_read_file_eof_cold_1();
  puVar8 = (uv_fs_t *)0x194385;
  puStack_3b0 = (uv_fs_t *)0x15576d;
  unlink("test_file");
  puStack_3b0 = (uv_fs_t *)0x155772;
  loop = uv_default_loop();
  iVar3 = 0;
  puStack_3b0 = (uv_fs_t *)0x155798;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_3b0 = (uv_fs_t *)0x1559f5;
    fs_read_file_eof_cold_1();
LAB_001559f5:
    puStack_3b0 = (uv_fs_t *)0x1559fa;
    fs_read_file_eof_cold_2();
LAB_001559fa:
    puStack_3b0 = (uv_fs_t *)0x1559ff;
    fs_read_file_eof_cold_3();
LAB_001559ff:
    puStack_3b0 = (uv_fs_t *)0x155a04;
    fs_read_file_eof_cold_4();
LAB_00155a04:
    puStack_3b0 = (uv_fs_t *)0x155a09;
    fs_read_file_eof_cold_5();
LAB_00155a09:
    puStack_3b0 = (uv_fs_t *)0x155a0e;
    fs_read_file_eof_cold_6();
LAB_00155a0e:
    puStack_3b0 = (uv_fs_t *)0x155a13;
    fs_read_file_eof_cold_7();
LAB_00155a13:
    puStack_3b0 = (uv_fs_t *)0x155a18;
    fs_read_file_eof_cold_8();
LAB_00155a18:
    puStack_3b0 = (uv_fs_t *)0x155a1d;
    fs_read_file_eof_cold_9();
LAB_00155a1d:
    puStack_3b0 = (uv_fs_t *)0x155a22;
    fs_read_file_eof_cold_10();
LAB_00155a22:
    puStack_3b0 = (uv_fs_t *)0x155a27;
    fs_read_file_eof_cold_11();
LAB_00155a27:
    puStack_3b0 = (uv_fs_t *)0x155a2c;
    fs_read_file_eof_cold_12();
LAB_00155a2c:
    puStack_3b0 = (uv_fs_t *)0x155a31;
    fs_read_file_eof_cold_13();
LAB_00155a31:
    puStack_3b0 = (uv_fs_t *)0x155a36;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001559f5;
    puStack_3b0 = (uv_fs_t *)0x1557ba;
    uv_fs_req_cleanup(&open_req1);
    puStack_3b0 = (uv_fs_t *)0x1557cb;
    uVar12 = uv_buf_init(test_buf,0xd);
    iVar3 = 0;
    puStack_3b0 = (uv_fs_t *)0x155809;
    iov = uVar12;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001559fa;
    if (write_req.result < 0) goto LAB_001559ff;
    puStack_3b0 = (uv_fs_t *)0x15582b;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0;
    puStack_3b0 = (uv_fs_t *)0x155841;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a04;
    if (close_req.result != 0) goto LAB_00155a09;
    puStack_3b0 = (uv_fs_t *)0x155863;
    uv_fs_req_cleanup(&close_req);
    iVar3 = 0;
    puStack_3b0 = (uv_fs_t *)0x155880;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155a0e;
    if (open_req1.result._4_4_ < 0) goto LAB_00155a13;
    puStack_3b0 = (uv_fs_t *)0x1558a2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_3b0 = (uv_fs_t *)0x1558c4;
    uVar12 = uv_buf_init(buf,0x20);
    iVar3 = 0;
    puStack_3b0 = (uv_fs_t *)0x155902;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_00155a18;
    if (read_req.result < 0) goto LAB_00155a1d;
    iVar3 = 0x2fbca0;
    puStack_3b0 = (uv_fs_t *)0x15592b;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00155a22;
    puVar8 = &read_req;
    puStack_3b0 = (uv_fs_t *)0x155942;
    uv_fs_req_cleanup(&read_req);
    puStack_3b0 = (uv_fs_t *)0x155953;
    uVar12 = uv_buf_init(buf,0x20);
    iVar3 = 0;
    puStack_3b0 = (uv_fs_t *)0x15598d;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a27;
    if (read_req.result != 0) goto LAB_00155a2c;
    puStack_3b0 = (uv_fs_t *)0x1559af;
    uv_fs_req_cleanup(&read_req);
    iVar3 = 0;
    puStack_3b0 = (uv_fs_t *)0x1559c5;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a31;
    if (close_req.result == 0) {
      puStack_3b0 = (uv_fs_t *)0x1559df;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  puStack_3b0 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_3b8 = (uv_fs_t *)0x155a41;
  puStack_3b0 = puVar8;
  fs_write_multiple_bufs(iVar3);
  puStack_3b8 = (uv_fs_t *)0x155a46;
  fs_write_multiple_bufs(iVar3);
  puStack_3b8 = (uv_fs_t *)0x155a4b;
  puVar4 = uv_default_loop();
  puStack_3b8 = (uv_fs_t *)0x155a5f;
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  puStack_3b8 = (uv_fs_t *)0x155a69;
  uv_run(puVar4,UV_RUN_DEFAULT);
  puStack_3b8 = (uv_fs_t *)0x155a6e;
  puVar5 = uv_default_loop();
  puStack_3b8 = (uv_fs_t *)0x155a76;
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_3b8 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_3c0 = puVar4;
  puStack_3b8 = unaff_R14;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00155f16:
    fs_write_multiple_bufs_cold_2();
LAB_00155f1b:
    fs_write_multiple_bufs_cold_3();
LAB_00155f20:
    fs_write_multiple_bufs_cold_4();
LAB_00155f25:
    fs_write_multiple_bufs_cold_5();
LAB_00155f2a:
    fs_write_multiple_bufs_cold_6();
LAB_00155f2f:
    fs_write_multiple_bufs_cold_7();
LAB_00155f34:
    fs_write_multiple_bufs_cold_8();
LAB_00155f39:
    fs_write_multiple_bufs_cold_9();
LAB_00155f3e:
    fs_write_multiple_bufs_cold_10();
LAB_00155f43:
    fs_write_multiple_bufs_cold_11();
LAB_00155f48:
    fs_write_multiple_bufs_cold_12();
LAB_00155f4d:
    fs_write_multiple_bufs_cold_13();
LAB_00155f52:
    fs_write_multiple_bufs_cold_14();
LAB_00155f57:
    fs_write_multiple_bufs_cold_15();
LAB_00155f5c:
    fs_write_multiple_bufs_cold_16();
LAB_00155f61:
    fs_write_multiple_bufs_cold_19();
LAB_00155f66:
    fs_write_multiple_bufs_cold_20();
LAB_00155f6b:
    fs_write_multiple_bufs_cold_21();
LAB_00155f70:
    fs_write_multiple_bufs_cold_22();
LAB_00155f75:
    fs_write_multiple_bufs_cold_23();
LAB_00155f7a:
    fs_write_multiple_bufs_cold_24();
LAB_00155f7f:
    fs_write_multiple_bufs_cold_25();
LAB_00155f84:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155f16;
    uv_fs_req_cleanup(&open_req1);
    uStack_3e8 = uv_buf_init(test_buf,0xd);
    uStack_3d8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_3e8,2,0,
                        (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155f1b;
    if (write_req.result < 0) goto LAB_00155f20;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00155f25;
    if (close_req.result != 0) goto LAB_00155f2a;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155f2f;
    if (open_req1.result._4_4_ < 0) goto LAB_00155f34;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_3e8 = uv_buf_init(buf,0xd);
    uStack_3d8 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var6 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_00155f39;
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_3e8,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155f3e;
    if (read_req.result != 0x1c) goto LAB_00155f43;
    iVar2 = 0x2fbca0;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00155f48;
    iVar2 = 0x2fd090;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_00155f4d;
    uv_fs_req_cleanup(&read_req);
    uVar12 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar12;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar3 != 0) goto LAB_00155f52;
    if (read_req.result != 0) goto LAB_00155f57;
    uv_fs_req_cleanup(&read_req);
    uStack_3e8 = uv_buf_init(buf,0xd);
    uStack_3d8 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_3e8,2,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155f5c;
    if (read_req.result == 0x1c) {
LAB_00155e14:
      iVar2 = 0x2fbca0;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_00155f61;
      iVar2 = 0x2fd090;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_00155f66;
      uv_fs_req_cleanup(&read_req);
      uVar12 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar12;
      iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar3 != 0) goto LAB_00155f6b;
      if (read_req.result != 0) goto LAB_00155f70;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar3 != 0) goto LAB_00155f75;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_00155f7a;
    }
    if (read_req.result != 0xd) goto LAB_00155f7f;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_3d8,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155f84;
    if (read_req.result == 0xf) goto LAB_00155e14;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_00156306:
    fs_write_alotof_bufs_cold_18();
LAB_0015630b:
    fs_write_alotof_bufs_cold_1();
LAB_00156310:
    fs_write_alotof_bufs_cold_2();
LAB_00156315:
    fs_write_alotof_bufs_cold_3();
LAB_0015631a:
    fs_write_alotof_bufs_cold_4();
LAB_0015631f:
    fs_write_alotof_bufs_cold_17();
LAB_00156324:
    fs_write_alotof_bufs_cold_5();
LAB_00156329:
    fs_write_alotof_bufs_cold_6();
LAB_0015632e:
    fs_write_alotof_bufs_cold_7();
LAB_00156333:
    fs_write_alotof_bufs_cold_8();
LAB_00156338:
    fs_write_alotof_bufs_cold_9();
LAB_0015633d:
    fs_write_alotof_bufs_cold_10();
LAB_00156342:
    fs_write_alotof_bufs_cold_12();
LAB_00156347:
    fs_write_alotof_bufs_cold_13();
LAB_0015634c:
    fs_write_alotof_bufs_cold_14();
LAB_00156351:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015630b;
    if (open_req1.result._4_4_ < 0) goto LAB_00156310;
    uv_fs_req_cleanup(&open_req1);
    lVar10 = 8;
    do {
      uVar12 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar10 + -8) = uVar12.base;
      *(size_t *)((long)&bufs->base + lVar10) = uVar12.len;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00156315;
    if (write_req.result != 0xac67d) goto LAB_0015631a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar7 = (char *)malloc(0xac67d);
    if (pcVar7 == (char *)0x0) goto LAB_0015631f;
    lVar10 = 8;
    pcVar11 = pcVar7;
    do {
      uVar12 = uv_buf_init(pcVar11,0xd);
      *(char **)((long)bufs + lVar10 + -8) = uVar12.base;
      *(size_t *)((long)&bufs->base + lVar10) = uVar12.len;
      lVar10 = lVar10 + 0x10;
      pcVar11 = pcVar11 + 0xd;
    } while (lVar10 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00156324;
    if (close_req.result != 0) goto LAB_00156329;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015632e;
    if (open_req1.result._4_4_ < 0) goto LAB_00156333;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00156338;
    if (read_req.result != 0x3400) goto LAB_0015633d;
    lVar10 = 0;
    do {
      pcVar11 = pcVar7 + lVar10;
      iVar3 = strncmp(pcVar11,test_buf,0xd);
      iVar2 = (int)pcVar11;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00156306;
      }
      lVar10 = lVar10 + 0xd;
    } while (lVar10 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar7);
    iVar2 = (uv_file)open_req1.result;
    _Var6 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00156342;
    uVar12 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar12;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar3 != 0) goto LAB_00156347;
    if (read_req.result != 0) goto LAB_0015634c;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00156351;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return extraout_EAX_00;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_480 = (uv_loop_t *)0x1563bd;
  unlink("test_file");
  puStack_480 = (uv_loop_t *)0x1563c2;
  loop = uv_default_loop();
  puStack_480 = (uv_loop_t *)0x1563d3;
  puVar5 = (uv_loop_t *)malloc(0xd4310);
  if (puVar5 == (uv_loop_t *)0x0) {
LAB_0015671f:
    puVar5 = puVar4;
    puStack_480 = (uv_loop_t *)0x156724;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156724:
    puStack_480 = (uv_loop_t *)0x156729;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156729:
    puStack_480 = (uv_loop_t *)0x15672e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015672e:
    puStack_480 = (uv_loop_t *)0x156733;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00156733:
    puStack_480 = (uv_loop_t *)0x156738;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156738:
    puStack_480 = (uv_loop_t *)0x15673d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015673d:
    puStack_480 = (uv_loop_t *)0x156742;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00156742:
    puStack_480 = (uv_loop_t *)0x156747;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156747:
    puStack_480 = (uv_loop_t *)0x15674c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015674c:
    puStack_480 = (uv_loop_t *)0x156751;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00156751:
    puStack_480 = (uv_loop_t *)0x156756;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156756:
    puStack_480 = (uv_loop_t *)0x15675b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015675b:
    puStack_480 = (uv_loop_t *)0x156760;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00156760:
    puStack_480 = (uv_loop_t *)0x156765;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156765:
    puStack_480 = (uv_loop_t *)0x15676a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_480 = (uv_loop_t *)0x156402;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156724;
    if (open_req1.result._4_4_ < 0) goto LAB_00156729;
    puStack_480 = (uv_loop_t *)0x156424;
    uv_fs_req_cleanup(&open_req1);
    puStack_480 = (uv_loop_t *)0x156435;
    uVar12 = uv_buf_init("0123456789",10);
    puStack_480 = (uv_loop_t *)0x156473;
    iov = uVar12;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015672e;
    if (write_req.result != 10) goto LAB_00156733;
    puStack_480 = (uv_loop_t *)0x156498;
    uv_fs_req_cleanup(&write_req);
    lVar10 = 8;
    do {
      puStack_480 = (uv_loop_t *)0x1564b2;
      uVar12 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar5->handle_queue + lVar10 + -0x18) = uVar12.base;
      *(size_t *)((long)puVar5->handle_queue + lVar10 + -0x10) = uVar12.len;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0xd4318);
    puStack_480 = (uv_loop_t *)0x1564f3;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156738;
    if (write_req.result != 0xac67d) goto LAB_0015673d;
    puStack_480 = (uv_loop_t *)0x156518;
    uv_fs_req_cleanup(&write_req);
    puStack_480 = (uv_loop_t *)0x156522;
    pcVar7 = (char *)malloc(0xac67d);
    if (pcVar7 == (char *)0x0) goto LAB_00156742;
    lVar10 = 8;
    pcVar11 = pcVar7;
    do {
      puStack_480 = (uv_loop_t *)0x156544;
      uVar12 = uv_buf_init(pcVar11,0xd);
      *(char **)((long)puVar5->handle_queue + lVar10 + -0x18) = uVar12.base;
      *(size_t *)((long)puVar5->handle_queue + lVar10 + -0x10) = uVar12.len;
      lVar10 = lVar10 + 0x10;
      pcVar11 = pcVar11 + 0xd;
    } while (lVar10 != 0xd4318);
    puStack_480 = (uv_loop_t *)0x156586;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156747;
    lVar10 = 0xd;
    if (iVar2 != 0xd) {
      lVar10 = 0x3400;
    }
    if (read_req.result != lVar10) goto LAB_0015674c;
    pcVar11 = pcVar7;
    uVar9 = 0;
    do {
      puStack_480 = (uv_loop_t *)0x1565d0;
      iVar3 = strncmp(pcVar11,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_480 = (uv_loop_t *)0x15671f;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar4 = puVar5;
        goto LAB_0015671f;
      }
      if (iVar2 == 0xd) break;
      pcVar11 = pcVar11 + 0xd;
      bVar1 = uVar9 < 0x3ff;
      uVar9 = uVar9 + 1;
    } while (bVar1);
    puStack_480 = (uv_loop_t *)0x1565fd;
    uv_fs_req_cleanup(&read_req);
    puStack_480 = (uv_loop_t *)0x156605;
    free(pcVar7);
    puStack_480 = (uv_loop_t *)0x15661c;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156751;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156756;
    puStack_480 = (uv_loop_t *)0x156650;
    uv_fs_req_cleanup(&stat_req);
    puStack_480 = (uv_loop_t *)0x156661;
    uVar12 = uv_buf_init(buf,0x20);
    puStack_480 = (uv_loop_t *)0x1566a2;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015675b;
    if (read_req.result != 0) goto LAB_00156760;
    puStack_480 = (uv_loop_t *)0x1566c4;
    uv_fs_req_cleanup(&read_req);
    puStack_480 = (uv_loop_t *)0x1566da;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156765;
    if (close_req.result == 0) {
      puStack_480 = (uv_loop_t *)0x1566f8;
      uv_fs_req_cleanup(&close_req);
      puStack_480 = (uv_loop_t *)0x156704;
      unlink("test_file");
      free(puVar5);
      return extraout_EAX_01;
    }
  }
  puStack_480 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_480 = puVar5;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001568e1;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001568e6;
    uv_fs_req_cleanup(&open_req1);
    uVar12 = uv_buf_init(acStack_482,2);
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001568eb;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001568f5;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001568e1:
    run_test_fs_read_dir_cold_2();
LAB_001568e6:
    run_test_fs_read_dir_cold_3();
LAB_001568eb:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001568f5:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_rename_to_existing_file) {
  int r;

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_rename(NULL, &rename_req, "test_file", "test_file2", NULL);
  ASSERT(r == 0);
  ASSERT(rename_req.result == 0);
  uv_fs_req_cleanup(&rename_req);

  r = uv_fs_open(NULL, &open_req1, "test_file2", O_RDONLY, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}